

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

SP __thiscall pbrt::Scene::loadFrom(Scene *this,istream *inStream)

{
  element_type *peVar1;
  element_type *peVar2;
  _func_int **pp_Var3;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  SP SVar5;
  BinaryReader binary;
  BinaryReader local_58;
  
  BinaryReader::BinaryReader(&local_58,inStream);
  if (local_58.readEntities.
      super__Vector_base<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.readEntities.
      super__Vector_base<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    peVar1 = local_58.readEntities.
             super__Vector_base<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      pp_Var3 = (_func_int **)0x0;
    }
    else {
      pp_Var3 = (_func_int **)__dynamic_cast(peVar1,&Entity::typeinfo,&typeinfo,0);
    }
    if (pp_Var3 == (_func_int **)0x0) {
      (this->super_Entity)._vptr_Entity = (_func_int **)0x0;
      (this->super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
      super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    }
    else {
      (this->super_Entity)._vptr_Entity = pp_Var3;
      peVar2 = (element_type *)
               local_58.readEntities.
               super__Vector_base<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this->super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
      super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      if (peVar2 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(peVar2->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                   super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peVar2->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                        super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(peVar2->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                   super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peVar2->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                        super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
    }
    std::vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>::
    ~vector(&local_58.readEntities);
    _Var4._M_pi = extraout_RDX;
    if (local_58.currentEntityData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.currentEntityData.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.currentEntityData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.currentEntityData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      _Var4._M_pi = extraout_RDX_00;
    }
    SVar5.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    SVar5.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (SP)SVar5.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"error in Scene::load - no entities");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Scene::SP Scene::loadFrom(std::istream &inStream)
  {
    BinaryReader binary(inStream);
    if (binary.readEntities.empty())
      throw std::runtime_error("error in Scene::load - no entities");
    Scene::SP scene = std::dynamic_pointer_cast<Scene>(binary.readEntities.back());
    assert(scene);
    return scene;
  }